

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaro_impl.hpp
# Opt level: O3

void duckdb_jaro_winkler::detail::flag_similar_characters_step<char>
               (BlockPatternMatchVector *PM,char T_j,FlaggedCharsMultiword *flagged,int64_t j,
               SearchBoundMask BoundMask)

{
  ulong *puVar1;
  ulong uVar2;
  byte bVar3;
  uint64_t uVar4;
  ulong uVar5;
  pointer puVar6;
  ulong uVar7;
  long lVar8;
  long block;
  
  lVar8 = j + 0x3f;
  if (-1 < j) {
    lVar8 = j;
  }
  lVar8 = lVar8 >> 6;
  bVar3 = (byte)j;
  if (BoundMask.words == 1) {
    uVar4 = common::BlockPatternMatchVector::get<char>(PM,BoundMask.empty_words,T_j);
    uVar5 = uVar4 & BoundMask.last_mask & BoundMask.first_mask;
    puVar6 = (flagged->P_flag).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar2 = puVar6[BoundMask.empty_words];
    uVar7 = ~uVar2 & uVar5;
    puVar6[BoundMask.empty_words] = -uVar7 & uVar5 | uVar2;
    puVar1 = (flagged->T_flag).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start + lVar8;
    *puVar1 = *puVar1 | (ulong)(uVar7 != 0) << (bVar3 & 0x3f);
  }
  else {
    block = BoundMask.empty_words;
    if (BoundMask.first_mask != 0) {
      uVar4 = common::BlockPatternMatchVector::get<char>(PM,BoundMask.empty_words,T_j);
      puVar6 = (flagged->P_flag).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar2 = puVar6[BoundMask.empty_words];
      uVar5 = ~uVar2 & uVar4 & BoundMask.first_mask;
      if (uVar5 != 0) {
        puVar6[BoundMask.empty_words] = -uVar5 & uVar5 | uVar2;
        puVar6 = (flagged->T_flag).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Vector_impl_data._M_start;
LAB_007421a7:
        puVar6[lVar8] = puVar6[lVar8] | 1L << (bVar3 & 0x3f);
        return;
      }
      block = BoundMask.empty_words + 1;
    }
    for (; block < BoundMask.words + BoundMask.empty_words + -1; block = block + 1) {
      uVar4 = common::BlockPatternMatchVector::get<char>(PM,block,T_j);
      puVar6 = (flagged->P_flag).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar2 = puVar6[block];
      uVar5 = ~uVar2 & uVar4;
      if (uVar5 != 0) {
        puVar6[block] = uVar4 & -uVar5 | uVar2;
        puVar6 = (flagged->T_flag).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_007421a7;
      }
    }
    if (BoundMask.last_mask != 0) {
      uVar4 = common::BlockPatternMatchVector::get<char>(PM,block,T_j);
      puVar6 = (flagged->P_flag).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar2 = puVar6[block];
      uVar5 = uVar4 & BoundMask.last_mask & ~uVar2;
      puVar6[block] = -uVar5 & uVar5 | uVar2;
      puVar1 = (flagged->T_flag).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar8;
      *puVar1 = *puVar1 | (ulong)(uVar5 != 0) << (bVar3 & 0x3f);
    }
  }
  return;
}

Assistant:

static inline void flag_similar_characters_step(const common::BlockPatternMatchVector& PM,
                                                CharT T_j, FlaggedCharsMultiword& flagged,
                                                int64_t j, SearchBoundMask BoundMask)
{
    using namespace intrinsics;

    int64_t j_word = j / 64;
    int64_t j_pos = j % 64;
    int64_t word = BoundMask.empty_words;
    int64_t last_word = word + BoundMask.words;

    if (BoundMask.words == 1) {
        uint64_t PM_j = PM.get(word, T_j) & BoundMask.last_mask & BoundMask.first_mask &
                        (~flagged.P_flag[static_cast<size_t>(word)]);

        flagged.P_flag[static_cast<size_t>(word)] |= blsi(PM_j);
        flagged.T_flag[static_cast<size_t>(j_word)] |= static_cast<uint64_t>(PM_j != 0) << j_pos;
        return;
    }

    if (BoundMask.first_mask) {
        uint64_t PM_j = PM.get(word, T_j) & BoundMask.first_mask & (~flagged.P_flag[static_cast<size_t>(word)]);

        if (PM_j) {
            flagged.P_flag[static_cast<size_t>(word)] |= blsi(PM_j);
            flagged.T_flag[static_cast<size_t>(j_word)] |= 1ull << j_pos;
            return;
        }
        word++;
    }

    for (; word < last_word - 1; ++word) {
        uint64_t PM_j = PM.get(word, T_j) & (~flagged.P_flag[static_cast<size_t>(word)]);

        if (PM_j) {
            flagged.P_flag[static_cast<size_t>(word)] |= blsi(PM_j);
            flagged.T_flag[static_cast<size_t>(j_word)] |= 1ull << j_pos;
            return;
        }
    }

    if (BoundMask.last_mask) {
        uint64_t PM_j = PM.get(word, T_j) & BoundMask.last_mask & (~flagged.P_flag[static_cast<size_t>(word)]);

        flagged.P_flag[static_cast<size_t>(word)] |= blsi(PM_j);
        flagged.T_flag[static_cast<size_t>(j_word)] |= static_cast<uint64_t>(PM_j != 0) << j_pos;
    }
}